

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O3

Error asmjit::formatFuncDetailValue
                (StringBuilder *sb,uint32_t logOptions,CodeEmitter *emitter,Value value)

{
  byte bVar1;
  Error EVar2;
  uint uVar3;
  char *str;
  
  if (value._value < 0x1000000) {
    str = "void";
  }
  else {
    uVar3 = value._value >> 0x18;
    if (uVar3 - 0x20 < 0x45) {
      bVar1 = TypeId::_info[(ulong)uVar3 + 0x80];
      if ((byte)(bVar1 - 0x20) < 0x13) {
        str = &DAT_00174654 + *(int *)(&DAT_00174654 + (ulong)(byte)(bVar1 - 0x20) * 4);
      }
      else {
        if ((char)bVar1 < '\0') {
          formatFuncDetailValue();
        }
        str = "unknown";
      }
      if ((byte)TypeId::_info[bVar1] < (byte)TypeId::_info[uVar3]) {
        EVar2 = StringBuilder::appendFormat
                          (sb,"%sx%u",str,
                           (ulong)((byte)TypeId::_info[uVar3] / (byte)TypeId::_info[bVar1]));
        goto LAB_00160709;
      }
    }
    else {
      str = "unknown";
    }
  }
  EVar2 = StringBuilder::_opString(sb,1,str,0xffffffffffffffff);
LAB_00160709:
  if (((EVar2 == 0) &&
      (((value._value >> 0x10 & 1) == 0 ||
       ((EVar2 = StringBuilder::_opChar(sb,1,':'), EVar2 == 0 &&
        (EVar2 = X86Logging::formatRegister
                           (sb,logOptions,emitter,
                            (uint)(emitter->_codeInfo)._archInfo.field_0.field_0._type,
                            value._value >> 8 & 0xff,value._value & 0xff), EVar2 == 0)))))) &&
     (((value._value >> 0x11 & 1) == 0 ||
      (EVar2 = StringBuilder::appendFormat(sb,":[%d]",(ulong)(value._value & 0xffff)), EVar2 == 0)))
     ) {
    EVar2 = 0;
  }
  return EVar2;
}

Assistant:

static Error formatFuncDetailValue(
  StringBuilder& sb,
  uint32_t logOptions,
  const CodeEmitter* emitter,
  FuncDetail::Value value) noexcept {

  uint32_t typeId = value.getTypeId();
  ASMJIT_PROPAGATE(formatTypeId(sb, typeId));

  if (value.byReg()) {
    ASMJIT_PROPAGATE(sb.appendChar(':'));
    ASMJIT_PROPAGATE(Logging::formatRegister(sb, logOptions, emitter, emitter->getArchType(), value.getRegType(), value.getRegId()));
  }

  if (value.byStack()) {
    ASMJIT_PROPAGATE(sb.appendFormat(":[%d]", static_cast<int>(value.getStackOffset())));
  }

  return kErrorOk;
}